

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O2

int __thiscall N::connect(N *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  pointer puVar1;
  pointer ppNVar2;
  uint uVar3;
  uint extraout_EAX;
  long lVar4;
  long lVar5;
  int iVar6;
  undefined4 in_register_00000034;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> in_stack_00000008;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> in_stack_00000010;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
  *in_stack_00000020;
  N *local_78;
  N **local_70;
  N **ppNStack_68;
  N **local_60;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *pCStack_58;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_50;
  
  local_78 = (N *)CONCAT44(in_register_00000034,__fd);
  uVar3 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::size
                    ((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                      *)&stack0x00000008);
  if (uVar3 != 0) {
    puVar1 = (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppNVar2 = (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar4 = (long)(this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3;
    iVar6 = 0;
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      if (ppNVar2[lVar5] == (N *)CONCAT44(in_register_00000034,__fd)) {
        if (lVar4 != lVar5) {
          puVar1 = puVar1 + lVar5;
          *puVar1 = *puVar1 + 1;
          goto LAB_00128618;
        }
        break;
      }
      iVar6 = iVar6 + puVar1[lVar5];
    }
    std::vector<N_*,_std::allocator<N_*>_>::push_back(&this->ps,&local_78);
    uVar3 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::
            size((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                  *)&stack0x00000008);
    local_70 = (N **)CONCAT44(local_70._4_4_,uVar3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->osi,(uint *)&local_70);
LAB_00128618:
    ppNVar2 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::end
              (&local_50,
               (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                *)&stack0x00000008);
    local_70 = in_stack_00000008._M_current;
    ppNStack_68 = in_stack_00000010._M_current;
    local_60 = in_stack_00000008._M_current;
    pCStack_58 = in_stack_00000020;
    std::vector<N*,std::allocator<N*>>::
    _M_range_insert<CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>>
              ((vector<N*,std::allocator<N*>> *)&this->os,ppNVar2 + iVar6);
    uVar3 = extraout_EAX;
  }
  return uVar3;
}

Assistant:

void connect(N* p, nodeit ns) {
        if (ns.size() == 0) return;
        int offset = 0, i = 0;
        while (i < ps.size() and ps[i] != p) offset += osi[i++];

        if (i == ps.size()) {ps.push_back(p); osi.push_back(ns.size());}
        else ++osi[i];

        os.insert(os.begin() + offset, ns.begin(), ns.end());
    }